

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_disconnect(connectdata *conn,_Bool dead_connection)

{
  connectdata *pcVar1;
  char *pcVar2;
  CURLcode CVar3;
  undefined7 in_register_00000031;
  
  if ((((int)CONCAT71(in_register_00000031,dead_connection) == 0) &&
      (pcVar1 = (conn->proto).ftpc.pp.conn, pcVar1 != (connectdata *)0x0)) &&
     ((pcVar1->bits).protoconnstart == true)) {
    CVar3 = imap_sendf(conn,"LOGOUT");
    if (CVar3 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_LOGOUT;
      imap_block_statemach(conn);
    }
  }
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  Curl_sasl_cleanup(conn,(conn->proto).imapc.authused);
  pcVar2 = (conn->proto).ftpc.prevpath;
  if (pcVar2 != (char *)0x0) {
    (*Curl_cfree)(pcVar2);
    (conn->proto).ftpc.prevpath = (char *)0x0;
  }
  pcVar2 = (conn->proto).imapc.mailbox_uidvalidity;
  if (pcVar2 != (char *)0x0) {
    (*Curl_cfree)(pcVar2);
    (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode imap_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct imap_conn *imapc = &conn->proto.imapc;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  /* The IMAP session may or may not have been allocated/setup at this
     point! */
  if(!dead_connection && imapc->pp.conn && imapc->pp.conn->bits.protoconnstart)
    if(!imap_perform_logout(conn))
      (void)imap_block_statemach(conn); /* ignore errors on LOGOUT */

  /* Disconnect from the server */
  Curl_pp_disconnect(&imapc->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, imapc->authused);

  /* Cleanup our connection based variables */
  Curl_safefree(imapc->mailbox);
  Curl_safefree(imapc->mailbox_uidvalidity);

  return CURLE_OK;
}